

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void ptls_free(ptls_t *tls)

{
  ptls_aead_context_t *ppVar1;
  ptls_key_exchange_context_t *ppVar2;
  st_ptls_async_job_t *psVar3;
  _func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t *p_Var4;
  st_ptls_update_open_count_t *psVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  void *get_sni_arg;
  int includes_appdata;
  
  uVar6 = ptls_log_point_maybe_active(&ptls_free::logpoint);
  if (uVar6 != 0) {
    uVar7 = ptls_log_conn_maybe_active(&tls->log_state,(_func_char_ptr_void_ptr *)tls,get_sni_arg);
    if ((uVar7 & uVar6) != 0) {
      includes_appdata = 0;
      do {
        ptls_log__do_write_start(&ptls_free::logpoint,1);
        ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)tls);
        iVar8 = ptls_log__do_write_end
                          (&ptls_free::logpoint,&tls->log_state,ptls_get_server_name,tls,
                           includes_appdata);
        includes_appdata = 1;
      } while (iVar8 != 0);
    }
  }
  ptls_buffer_dispose(&(tls->recvbuf).rec);
  ptls_buffer_dispose(&(tls->recvbuf).mess);
  free_exporter_master_secret(tls,1);
  free_exporter_master_secret(tls,0);
  if (tls->key_schedule != (ptls_key_schedule_t *)0x0) {
    key_schedule_free(tls->key_schedule);
  }
  ppVar1 = (tls->traffic_protection).dec.aead;
  if (ppVar1 != (ptls_aead_context_t *)0x0) {
    ptls_aead_free(ppVar1);
  }
  ppVar1 = (tls->traffic_protection).enc.aead;
  if (ppVar1 != (ptls_aead_context_t *)0x0) {
    ptls_aead_free(ppVar1);
  }
  free(tls->server_name);
  free(tls->negotiated_protocol);
  clear_ech(&tls->ech,(byte)tls->field_0x1e8 & 1);
  if ((tls->field_0x1e8 & 1) == 0) {
    ppVar2 = (tls->field_19).client.key_share_ctx;
    if (ppVar2 != (ptls_key_exchange_context_t *)0x0) {
      (*ppVar2->on_exchange)
                (&(tls->field_19).client.key_share_ctx,1,(ptls_iovec_t *)0x0,
                 (ptls_iovec_t)ZEXT816(0));
    }
    free((tls->field_19).client.certificate_request.context.base);
  }
  else {
    psVar3 = (tls->field_19).server.async_job;
    if (psVar3 != (st_ptls_async_job_t *)0x0) {
      (*psVar3->destroy_)(psVar3);
    }
  }
  p_Var4 = (tls->certificate_verify).cb;
  if (p_Var4 != (_func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t *)0x0) {
    (*p_Var4)((tls->certificate_verify).verify_ctx,0,(ptls_iovec_t)ZEXT816(0),
              (ptls_iovec_t)ZEXT816(0));
  }
  if (tls->pending_handshake_secret != (uint8_t *)0x0) {
    (*ptls_clear_memory)(tls->pending_handshake_secret,0x40);
    free(tls->pending_handshake_secret);
  }
  psVar5 = tls->ctx->update_open_count;
  if (psVar5 != (st_ptls_update_open_count_t *)0x0) {
    (*psVar5->cb)(psVar5,-1);
  }
  (*ptls_clear_memory)(tls,0x2b8);
  free(tls);
  return;
}

Assistant:

void ptls_free(ptls_t *tls)
{
    PTLS_PROBE0(FREE, tls);
    PTLS_LOG_CONN(free, tls, {});

    ptls_buffer_dispose(&tls->recvbuf.rec);
    ptls_buffer_dispose(&tls->recvbuf.mess);
    free_exporter_master_secret(tls, 1);
    free_exporter_master_secret(tls, 0);
    if (tls->key_schedule != NULL)
        key_schedule_free(tls->key_schedule);
    if (tls->traffic_protection.dec.aead != NULL)
        ptls_aead_free(tls->traffic_protection.dec.aead);
    if (tls->traffic_protection.enc.aead != NULL)
        ptls_aead_free(tls->traffic_protection.enc.aead);
    free(tls->server_name);
    free(tls->negotiated_protocol);
    clear_ech(&tls->ech, tls->is_server);
    if (tls->is_server) {
        if (tls->server.async_job != NULL)
            tls->server.async_job->destroy_(tls->server.async_job);
    } else {
        if (tls->client.key_share_ctx != NULL)
            tls->client.key_share_ctx->on_exchange(&tls->client.key_share_ctx, 1, NULL, ptls_iovec_init(NULL, 0));
        if (tls->client.certificate_request.context.base != NULL)
            free(tls->client.certificate_request.context.base);
    }
    if (tls->certificate_verify.cb != NULL)
        tls->certificate_verify.cb(tls->certificate_verify.verify_ctx, 0, ptls_iovec_init(NULL, 0), ptls_iovec_init(NULL, 0));
    if (tls->pending_handshake_secret != NULL) {
        ptls_clear_memory(tls->pending_handshake_secret, PTLS_MAX_DIGEST_SIZE);
        free(tls->pending_handshake_secret);
    }
    update_open_count(tls->ctx, -1);
    ptls_clear_memory(tls, sizeof(*tls));
    free(tls);
}